

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XBM_Image.cxx
# Opt level: O2

void __thiscall Fl_XBM_Image::Fl_XBM_Image(Fl_XBM_Image *this,char *name)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uchar *puVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  uint t;
  int wh [2];
  char buffer [1024];
  char junk [1024];
  
  Fl_Bitmap::Fl_Bitmap(&this->super_Fl_Bitmap,(char *)0x0,0,0);
  (this->super_Fl_Bitmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Bitmap_0027a0d8;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      do {
        pcVar4 = fgets(buffer,0x400,__stream);
        if (pcVar4 == (char *)0x0) goto LAB_001d9064;
        iVar2 = __isoc99_sscanf(buffer,"#define %s %d",junk,wh + lVar8);
      } while (iVar2 < 2);
    }
    do {
      pcVar4 = fgets(buffer,0x400,__stream);
      if (pcVar4 == (char *)0x0) goto LAB_001d9064;
      iVar2 = bcmp(buffer,"static ",7);
    } while (iVar2 != 0);
    (this->super_Fl_Bitmap).super_Fl_Image.w_ = wh[0];
    (this->super_Fl_Bitmap).super_Fl_Image.h_ = wh[1];
    iVar2 = ((wh[0] + 7) / 8) * wh[1];
    puVar5 = (uchar *)operator_new__((long)iVar2);
    (this->super_Fl_Bitmap).array = puVar5;
    iVar7 = 0;
LAB_001d9004:
    pcVar4 = buffer;
    if ((iVar7 < iVar2) && (pcVar6 = fgets(pcVar4,0x400,__stream), pcVar6 != (char *)0x0)) {
      do {
        if ((*pcVar4 == '\0') || (iVar2 <= iVar7)) goto LAB_001d9004;
        iVar3 = __isoc99_sscanf(pcVar4," 0x%x",&t);
        if (0 < iVar3) {
          *puVar5 = (uchar)t;
          puVar5 = puVar5 + 1;
          iVar7 = iVar7 + 1;
        }
        do {
          cVar1 = *pcVar4;
          if (cVar1 == '\0') break;
          pcVar4 = pcVar4 + 1;
        } while (cVar1 != ',');
      } while( true );
    }
LAB_001d9064:
    fclose(__stream);
  }
  return;
}

Assistant:

Fl_XBM_Image::Fl_XBM_Image(const char *name) : Fl_Bitmap((const char *)0,0,0) {
  FILE	*f;
  uchar	*ptr;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  char buffer[1024];
  char junk[1024];
  int wh[2]; // width and height
  int i;
  for (i = 0; i<2; i++) {
    for (;;) {
      if (!fgets(buffer,1024,f)) {
        fclose(f);
	return;
      }
      int r = sscanf(buffer,"#define %s %d",junk,&wh[i]);
      if (r >= 2) break;
    }
  }

  // skip to data array:
  for (;;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    if (!strncmp(buffer,"static ",7)) break;
  }

  // Allocate memory...
  w(wh[0]);
  h(wh[1]);

  int n = ((wh[0]+7)/8)*wh[1];
  array = new uchar[n];

  // read the data:
  for (i = 0, ptr = (uchar *)array; i < n;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    const char *a = buffer;
    while (*a && i<n) {
      unsigned int t;
      if (sscanf(a," 0x%x",&t)>0) {
        *ptr++ = (uchar)t;
	i ++;
      }
      while (*a && *a++ != ',') {/*empty*/}
    }
  }

  fclose(f);
}